

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cc
# Opt level: O0

void __thiscall
flow::Handler::setCode(Handler *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *code)

{
  Opcode OVar1;
  reference pvVar2;
  unsigned_long *program;
  size_type programSize;
  size_t sVar3;
  Instruction local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *code_local;
  Handler *this_local;
  
  local_18 = code;
  code_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->code_,code);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->code_);
  OVar1 = opcode(*pvVar2);
  if (OVar1 != EXIT) {
    local_20 = makeInstruction(EXIT,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->code_,&local_20);
  }
  program = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(&this->code_);
  programSize = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->code_);
  sVar3 = computeStackSize(program,programSize);
  this->stackSize_ = sVar3;
  return;
}

Assistant:

void Handler::setCode(std::vector<Instruction> code) {
  code_ = std::move(code);

  if (opcode(code_.back()) != Opcode::EXIT)
    code_.push_back(makeInstruction(Opcode::EXIT, false));

  stackSize_ = computeStackSize(code_.data(), code_.size());

#if defined(ENABLE_FLOW_DIRECT_THREADED_VM)
  directThreadedCode_.clear();
#endif
}